

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void anon_unknown.dwarf_7cda50::ProcessMetadata
               (ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *set,
               ConversionData *conv,Metadata *properties,string *prefix,uint nest)

{
  bool bVar1;
  Lazy *this;
  long lVar2;
  IfcPropertySingleValue *pIVar3;
  __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var4;
  element_type *peVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  mapped_type *pmVar7;
  double *pdVar8;
  long *plVar9;
  undefined1 *this_00;
  __shared_ptr *this_01;
  ostream *poVar10;
  size_type sVar11;
  IfcComplexProperty *pIVar12;
  IfcComplexProperty *complexProp;
  long local_650;
  int64_t value_5;
  INTEGER *val_3;
  PrimitiveDataType<double> *pPStack_638;
  float value_4;
  REAL *val_2;
  string value_3;
  STRING *str_1;
  Out *v;
  const_iterator __end4;
  const_iterator __begin4;
  Out *__range4;
  stringstream local_5e0 [4];
  uint index;
  stringstream ss;
  ostream local_5d0 [376];
  IfcPropertyListValue *local_458;
  IfcPropertyListValue *listValue;
  stringstream local_430 [8];
  stringstream s_1;
  undefined1 local_420 [376];
  long local_2a8;
  int64_t value_2;
  INTEGER *val_1;
  stringstream local_278 [8];
  stringstream s;
  undefined1 local_268 [380];
  float local_ec;
  PrimitiveDataType<double> *pPStack_e8;
  float value_1;
  REAL *val;
  string value;
  STRING *str;
  IfcPropertySingleValue *singleValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string *key;
  IfcProperty *property;
  const_iterator __end1;
  const_iterator __begin1;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *__range1;
  uint nest_local;
  string *prefix_local;
  Metadata *properties_local;
  ConversionData *conv_local;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *set_local;
  
  __end1 = std::
           vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
           ::begin(&set->
                    super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                  );
  property = (IfcProperty *)
             std::
             vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
             ::end(&set->
                    super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                  );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>_>
                                     *)&property), bVar1) {
    this = (Lazy *)__gnu_cxx::
                   __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>_>
                   ::operator*(&__end1);
    key = (string *)Assimp::STEP::Lazy::operator_cast_to_IfcProperty_(this);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) {
      std::__cxx11::string::string((string *)&local_78,(string *)(key->field_2)._M_local_buf);
    }
    else {
      std::operator+(&local_98,prefix,".");
      std::operator+(&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &key->field_2);
      std::__cxx11::string::~string((string *)&local_98);
    }
    local_58 = &local_78;
    pIVar3 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPropertySingleValue>
                       ((Object *)(&key->_M_dataplus + *(long *)(*(long *)key + -0x18)));
    if (pIVar3 == (IfcPropertySingleValue *)0x0) {
      local_458 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPropertyListValue>
                            ((Object *)(&key->_M_dataplus + *(long *)(*(long *)key + -0x18)));
      if (local_458 == (IfcPropertyListValue *)0x0) {
        pIVar12 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcComplexProperty>
                            ((Object *)(&key->_M_dataplus + *(long *)(*(long *)key + -0x18)));
        if (pIVar12 == (IfcComplexProperty *)0x0) {
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,local_58);
          std::__cxx11::string::operator=((string *)pmVar7,"");
        }
        else if (nest < 3) {
          ProcessMetadata(&pIVar12->HasProperties,conv,properties,local_58,nest + 1);
        }
        else {
          Assimp::LogFunctions<Assimp::IFCImporter>::LogError
                    ("maximum nesting level for IfcComplexProperty reached, skipping this property."
                    );
        }
      }
      else {
        std::__cxx11::stringstream::stringstream(local_5e0);
        std::operator<<(local_5d0,"[");
        __range4._4_4_ = 0;
        this_00 = &(local_458->
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).
                   field_0x10;
        __end4 = std::
                 vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                 ::begin((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                          *)this_00);
        v = (Out *)std::
                   vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                   ::end((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                          *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
                                           *)&v), bVar1) {
          this_01 = (__shared_ptr *)
                    __gnu_cxx::
                    __normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
                    ::operator*(&__end4);
          bVar1 = std::__shared_ptr::operator_cast_to_bool(this_01);
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this_01);
            value_3.field_2._8_8_ =
                 Assimp::STEP::EXPRESS::DataType::
                 ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>>(peVar5);
            if ((PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)value_3.field_2._8_8_ ==
                (PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
              peVar5 = std::
                       __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)this_01);
              pPStack_638 = Assimp::STEP::EXPRESS::DataType::
                            ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>(peVar5);
              if (pPStack_638 == (PrimitiveDataType<double> *)0x0) {
                peVar5 = std::
                         __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this_01);
                value_5 = (int64_t)Assimp::STEP::EXPRESS::DataType::
                                   ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<long>>(peVar5);
                if ((PrimitiveDataType<long> *)value_5 != (PrimitiveDataType<long> *)0x0) {
                  plVar9 = Assimp::STEP::EXPRESS::PrimitiveDataType::operator_cast_to_long_
                                     ((PrimitiveDataType *)value_5);
                  local_650 = *plVar9;
                  std::ostream::operator<<(local_5d0,local_650);
                }
              }
              else {
                pdVar8 = Assimp::STEP::EXPRESS::PrimitiveDataType::operator_cast_to_double_
                                   ((PrimitiveDataType *)pPStack_638);
                val_3._4_4_ = (float)*pdVar8;
                std::ostream::operator<<(local_5d0,val_3._4_4_);
              }
            }
            else {
              pbVar6 = Assimp::STEP::EXPRESS::PrimitiveDataType::operator_cast_to_string_
                                 ((PrimitiveDataType *)value_3.field_2._8_8_);
              std::__cxx11::string::string((string *)&val_2,(string *)pbVar6);
              poVar10 = std::operator<<(local_5d0,"\'");
              poVar10 = std::operator<<(poVar10,(string *)&val_2);
              std::operator<<(poVar10,"\'");
              std::__cxx11::string::~string((string *)&val_2);
            }
            sVar11 = std::
                     vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                     ::size((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                             *)&(local_458->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>
                                ).field_0x10);
            if (__range4._4_4_ + 1 < sVar11) {
              std::operator<<(local_5d0,",");
            }
            __range4._4_4_ = __range4._4_4_ + 1;
          }
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_*,_std::vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>_>
          ::operator++(&__end4);
        }
        std::operator<<(local_5d0,"]");
        std::__cxx11::stringstream::str();
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,local_58);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&complexProp);
        std::__cxx11::string::~string((string *)&complexProp);
        std::__cxx11::stringstream::~stringstream(local_5e0);
      }
    }
    else {
      bVar1 = Assimp::STEP::Maybe::operator_cast_to_bool
                        ((Maybe *)&(pIVar3->
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>
                                   ).field_0x10);
      if (bVar1) {
        p_Var4 = (__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)Assimp::STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::
                    Get((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)
                        &(pIVar3->
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
                         field_0x10);
        peVar5 = std::
                 __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var4);
        value.field_2._8_8_ =
             Assimp::STEP::EXPRESS::DataType::
             ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>>(peVar5);
        if ((PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)value.field_2._8_8_ ==
            (PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          p_Var4 = (__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)Assimp::STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::
                      Get((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)
                          &(pIVar3->
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>)
                           .field_0x10);
          peVar5 = std::
                   __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var4);
          pPStack_e8 = Assimp::STEP::EXPRESS::DataType::
                       ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>(peVar5);
          if (pPStack_e8 == (PrimitiveDataType<double> *)0x0) {
            p_Var4 = (__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)Assimp::STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>
                        ::Get((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)
                              &(pIVar3->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>
                               ).field_0x10);
            peVar5 = std::
                     __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(p_Var4);
            value_2 = (int64_t)Assimp::STEP::EXPRESS::DataType::
                               ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<long>>(peVar5);
            if ((PrimitiveDataType<long> *)value_2 != (PrimitiveDataType<long> *)0x0) {
              plVar9 = Assimp::STEP::EXPRESS::PrimitiveDataType::operator_cast_to_long_
                                 ((PrimitiveDataType *)value_2);
              local_2a8 = *plVar9;
              std::__cxx11::stringstream::stringstream(local_430);
              std::ostream::operator<<(local_420,local_2a8);
              std::__cxx11::stringstream::str();
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](properties,local_58);
              std::__cxx11::string::operator=((string *)pmVar7,(string *)&listValue);
              std::__cxx11::string::~string((string *)&listValue);
              std::__cxx11::stringstream::~stringstream(local_430);
            }
          }
          else {
            pdVar8 = Assimp::STEP::EXPRESS::PrimitiveDataType::operator_cast_to_double_
                               ((PrimitiveDataType *)pPStack_e8);
            local_ec = (float)*pdVar8;
            std::__cxx11::stringstream::stringstream(local_278);
            std::ostream::operator<<(local_268,local_ec);
            std::__cxx11::stringstream::str();
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,local_58);
            std::__cxx11::string::operator=((string *)pmVar7,(string *)&val_1);
            std::__cxx11::string::~string((string *)&val_1);
            std::__cxx11::stringstream::~stringstream(local_278);
          }
        }
        else {
          pbVar6 = Assimp::STEP::EXPRESS::PrimitiveDataType::operator_cast_to_string_
                             ((PrimitiveDataType *)value.field_2._8_8_);
          std::__cxx11::string::string((string *)&val,(string *)pbVar6);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,local_58);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&val);
          std::__cxx11::string::~string((string *)&val);
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_78);
    __gnu_cxx::
    __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ProcessMetadata(const Schema_2x3::ListOf< Schema_2x3::Lazy< Schema_2x3::IfcProperty >, 1, 0 >& set, ConversionData& conv, Metadata& properties,
        const std::string& prefix = "",
        unsigned int nest = 0) {
    for(const Schema_2x3::IfcProperty& property : set) {
        const std::string& key = prefix.length() > 0 ? (prefix + "." + property.Name) : property.Name;
        if (const Schema_2x3::IfcPropertySingleValue* const singleValue = property.ToPtr<Schema_2x3::IfcPropertySingleValue>()) {
            if (singleValue->NominalValue) {
                if (const ::Assimp::STEP::EXPRESS::STRING* str = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::STRING>()) {
                    std::string value = static_cast<std::string>(*str);
                    properties[key]=value;
                }
                else if (const ::Assimp::STEP::EXPRESS::REAL* val = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                    float value = static_cast<float>(*val);
                    std::stringstream s;
                    s << value;
                    properties[key]=s.str();
                }
                else if (const ::Assimp::STEP::EXPRESS::INTEGER* val = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::INTEGER>()) {
                    int64_t value = static_cast<int64_t>(*val);
                    std::stringstream s;
                    s << value;
                    properties[key]=s.str();
                }
            }
        }
        else if (const Schema_2x3::IfcPropertyListValue* const listValue = property.ToPtr<Schema_2x3::IfcPropertyListValue>()) {
            std::stringstream ss;
            ss << "[";
            unsigned index=0;
            for(const Schema_2x3::IfcValue::Out& v : listValue->ListValues) {
                if (!v) continue;
                if (const ::Assimp::STEP::EXPRESS::STRING* str = v->ToPtr<::Assimp::STEP::EXPRESS::STRING>()) {
                    std::string value = static_cast<std::string>(*str);
                    ss << "'" << value << "'";
                }
                else if (const ::Assimp::STEP::EXPRESS::REAL* val = v->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                    float value = static_cast<float>(*val);
                    ss << value;
                }
                else if (const ::Assimp::STEP::EXPRESS::INTEGER* val = v->ToPtr<::Assimp::STEP::EXPRESS::INTEGER>()) {
                    int64_t value = static_cast<int64_t>(*val);
                    ss << value;
                }
                if (index+1<listValue->ListValues.size()) {
                    ss << ",";
                }
                index++;
            }
            ss << "]";
            properties[key]=ss.str();
        }
        else if (const Schema_2x3::IfcComplexProperty* const complexProp = property.ToPtr<Schema_2x3::IfcComplexProperty>()) {
            if(nest > 2) { // mostly arbitrary limit to prevent stack overflow vulnerabilities
                IFCImporter::LogError("maximum nesting level for IfcComplexProperty reached, skipping this property.");
            }
            else {
                ProcessMetadata(complexProp->HasProperties, conv, properties, key, nest + 1);
            }
        }
        else {
            properties[key]="";
        }
    }
}